

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O0

Expression * __thiscall
wasm::OptimizeInstructions::combineOr(OptimizeInstructions *this,Binary *curr)

{
  Expression *pEVar1;
  Matcher<wasm::Binary_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::BinaryOp>_>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
  matcher;
  Matcher<wasm::Binary_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::BinaryOp>_>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
  matcher_00;
  Matcher<wasm::Binary_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::BinaryOp>_>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
  matcher_01;
  Matcher<wasm::Binary_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::BinaryOp>_>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
  matcher_02;
  bool bVar2;
  BinaryOp BVar3;
  Binary *other;
  Match *this_00;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>
  *in_R8;
  bool local_5d1;
  bool local_5bb;
  byte local_5a9;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>
  local_598;
  Binary *local_558 [2];
  Matcher<wasm::Binary_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::BinaryOp>_>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
  local_548;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>
  local_510;
  Binary *local_4d0 [2];
  Matcher<wasm::Binary_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::BinaryOp>_>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
  local_4c0;
  Const *local_488;
  Const *cy_1;
  Const *cx_1;
  Expression *y_1;
  Expression *x_1;
  Binary *by_1;
  Binary *bx_1;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>
  local_450;
  Binary *local_410 [2];
  Matcher<wasm::Binary_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::BinaryOp>_>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
  local_400;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>
  local_3c8;
  Binary *local_388 [2];
  Matcher<wasm::Binary_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::BinaryOp>_>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
  local_378;
  Const *local_340;
  Const *cy;
  Const *cx;
  Expression *y;
  Expression *x;
  Binary *by;
  Binary *bx;
  EffectAnalyzer local_308;
  byte local_191;
  EffectAnalyzer local_190;
  Binary *local_30;
  Binary *right;
  Binary *left;
  Binary *curr_local;
  OptimizeInstructions *this_local;
  
  left = curr;
  curr_local = (Binary *)this;
  if (curr->op != OrInt32) {
    __assert_fail("curr->op == OrInt32",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/OptimizeInstructions.cpp"
                  ,0xdef,"Expression *wasm::OptimizeInstructions::combineOr(Binary *)");
  }
  right = Expression::dynCast<wasm::Binary>(curr->left);
  if ((right != (Binary *)0x0) &&
     (local_30 = Expression::dynCast<wasm::Binary>(left->right), local_30 != (Binary *)0x0)) {
    local_191 = 0;
    bx._7_1_ = 0;
    local_5a9 = 0;
    if (right->op != local_30->op) {
      curr = (Binary *)local_30->left;
      bVar2 = ExpressionAnalyzer::equal(right->left,(Expression *)curr);
      local_5a9 = 0;
      if (bVar2) {
        curr = (Binary *)local_30->right;
        bVar2 = ExpressionAnalyzer::equal(right->right,(Expression *)curr);
        local_5a9 = 0;
        if (bVar2) {
          curr = (Binary *)this;
          effects(&local_190,this,right->left);
          local_191 = 1;
          bVar2 = EffectAnalyzer::hasSideEffects(&local_190);
          local_5a9 = 0;
          if (!bVar2) {
            curr = (Binary *)this;
            effects(&local_308,this,right->right);
            bx._7_1_ = 1;
            bVar2 = EffectAnalyzer::hasSideEffects(&local_308);
            local_5a9 = bVar2 ^ 0xff;
          }
        }
      }
    }
    if ((bx._7_1_ & 1) != 0) {
      EffectAnalyzer::~EffectAnalyzer(&local_308);
    }
    if ((local_191 & 1) != 0) {
      EffectAnalyzer::~EffectAnalyzer(&local_190);
    }
    if ((((local_5a9 & 1) != 0) && (right->op == EqInt32)) && (local_30->op == GtSInt32)) {
      right->op = GeSInt32;
      return (Expression *)right;
    }
  }
  pEVar1 = left->left;
  local_388[0] = (Binary *)
                 Match::any((Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)&y,
                            (Expression **)curr);
  Match::ival(&local_3c8,&cy);
  other = (Binary *)&by;
  Match::
  binary<wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>>>>>
            (&local_378,(Match *)other,local_388,
             (Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)&local_3c8,in_R8);
  matcher._8_8_ = local_378._8_8_;
  matcher.binder = local_378.binder;
  matcher.submatchers.curr.binder = local_378.submatchers.curr.binder;
  matcher.submatchers.curr._8_8_ = local_378.submatchers.curr._8_8_;
  matcher.submatchers.next.curr = local_378.submatchers.next.curr;
  matcher.submatchers.next.next.curr = local_378.submatchers.next.next.curr;
  matcher.submatchers.next.next._8_8_ = local_378.submatchers.next.next._8_8_;
  bVar2 = Match::
          matches<wasm::Match::Internal::Matcher<wasm::Binary*,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::BinaryOp>>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>>>>&>>
                    (pEVar1,matcher);
  local_5bb = false;
  if (bVar2) {
    pEVar1 = left->right;
    local_410[0] = (Binary *)
                   Match::any((Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)&cx,
                              (Expression **)other);
    Match::ival(&local_450,&local_340);
    other = (Binary *)&x;
    Match::
    binary<wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>>>>>
              (&local_400,(Match *)other,local_410,
               (Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)&local_450,in_R8);
    matcher_00._8_8_ = local_400._8_8_;
    matcher_00.binder = local_400.binder;
    matcher_00.submatchers.curr.binder = local_400.submatchers.curr.binder;
    matcher_00.submatchers.curr._8_8_ = local_400.submatchers.curr._8_8_;
    matcher_00.submatchers.next.curr = local_400.submatchers.next.curr;
    matcher_00.submatchers.next.next.curr = local_400.submatchers.next.next.curr;
    matcher_00.submatchers.next.next._8_8_ = local_400.submatchers.next.next._8_8_;
    bVar2 = Match::
            matches<wasm::Match::Internal::Matcher<wasm::Binary*,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::BinaryOp>>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>>>>&>>
                      (pEVar1,matcher_00);
    local_5bb = false;
    if ((bVar2) && (local_5bb = false, by->op == *(BinaryOp *)(x + 1))) {
      other = (Binary *)
              &(cx->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression.type;
      bVar2 = wasm::Type::operator==(&y->type,(Type *)other);
      local_5bb = false;
      if (bVar2) {
        other = (Binary *)&local_340->value;
        bVar2 = wasm::Literal::operator==(&cy->value,(Literal *)other);
        local_5bb = false;
        if (bVar2) {
          other = by;
          local_5bb = inversesOr(this,by);
        }
      }
    }
  }
  if (local_5bb == false) {
    pEVar1 = left->left;
    local_4d0[0] = (Binary *)
                   Match::any((Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)&y_1,
                              (Expression **)other);
    Match::ival(&local_510,&cy_1);
    this_00 = (Match *)&by_1;
    Match::
    binary<wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>>>>>
              (&local_4c0,this_00,local_4d0,
               (Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)&local_510,in_R8);
    matcher_01._8_8_ = local_4c0._8_8_;
    matcher_01.binder = local_4c0.binder;
    matcher_01.submatchers.curr.binder = local_4c0.submatchers.curr.binder;
    matcher_01.submatchers.curr._8_8_ = local_4c0.submatchers.curr._8_8_;
    matcher_01.submatchers.next.curr = local_4c0.submatchers.next.curr;
    matcher_01.submatchers.next.next.curr = local_4c0.submatchers.next.next.curr;
    matcher_01.submatchers.next.next._8_8_ = local_4c0.submatchers.next.next._8_8_;
    bVar2 = Match::
            matches<wasm::Match::Internal::Matcher<wasm::Binary*,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::BinaryOp>>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>>>>&>>
                      (pEVar1,matcher_01);
    local_5d1 = false;
    if (bVar2) {
      pEVar1 = left->right;
      local_558[0] = (Binary *)
                     Match::any((Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)
                                &cx_1,(Expression **)this_00);
      Match::ival(&local_598,&local_488);
      Match::
      binary<wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>>>>>
                (&local_548,(Match *)&x_1,local_558,
                 (Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)&local_598,in_R8);
      matcher_02._8_8_ = local_548._8_8_;
      matcher_02.binder = local_548.binder;
      matcher_02.submatchers.curr.binder = local_548.submatchers.curr.binder;
      matcher_02.submatchers.curr._8_8_ = local_548.submatchers.curr._8_8_;
      matcher_02.submatchers.next.curr = local_548.submatchers.next.curr;
      matcher_02.submatchers.next.next.curr = local_548.submatchers.next.next.curr;
      matcher_02.submatchers.next.next._8_8_ = local_548.submatchers.next.next._8_8_;
      bVar2 = Match::
              matches<wasm::Match::Internal::Matcher<wasm::Binary*,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::BinaryOp>>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>>>>&>>
                        (pEVar1,matcher_02);
      local_5d1 = false;
      if ((bVar2) && (local_5d1 = false, by_1->op == *(BinaryOp *)(x_1 + 1))) {
        bVar2 = wasm::Type::operator==
                          (&y_1->type,
                           &(cx_1->super_SpecificExpression<(wasm::Expression::Id)14>).
                            super_Expression.type);
        local_5d1 = false;
        if (bVar2) {
          bVar2 = wasm::Literal::operator==(&cy_1->value,&local_488->value);
          local_5d1 = false;
          if (bVar2) {
            local_5d1 = preserveOr(this,by_1);
          }
        }
      }
    }
    if (local_5d1 == false) {
      this_local = (OptimizeInstructions *)0x0;
    }
    else {
      BVar3 = Abstract::getBinary((Type)(y_1->type).id,Or);
      *(BinaryOp *)(x_1 + 1) = BVar3;
      (x_1->type).id = (y_1->type).id;
      x_1[1].type.id = (uintptr_t)y_1;
      *(Const **)(x_1 + 2) = cx_1;
      by_1->left = x_1;
      this_local = (OptimizeInstructions *)by_1;
    }
  }
  else {
    bx_1 = (Binary *)(y->type).id;
    BVar3 = Abstract::getBinary((Type)bx_1,And);
    *(BinaryOp *)(x + 1) = BVar3;
    (x->type).id = (y->type).id;
    x[1].type.id = (uintptr_t)y;
    *(Const **)(x + 2) = cx;
    by->left = x;
    this_local = (OptimizeInstructions *)by;
  }
  return (Expression *)this_local;
}

Assistant:

Expression* combineOr(Binary* curr) {
    assert(curr->op == OrInt32);

    using namespace Abstract;
    using namespace Match;

    if (auto* left = curr->left->dynCast<Binary>()) {
      if (auto* right = curr->right->dynCast<Binary>()) {
        if (left->op != right->op &&
            ExpressionAnalyzer::equal(left->left, right->left) &&
            ExpressionAnalyzer::equal(left->right, right->right) &&
            !effects(left->left).hasSideEffects() &&
            !effects(left->right).hasSideEffects()) {
          switch (left->op) {
            //   (x > y) | (x == y)    ==>    x >= y
            case EqInt32: {
              if (right->op == GtSInt32) {
                left->op = GeSInt32;
                return left;
              }
              break;
            }
            default: {
            }
          }
        }
      }
    }
    {
      // Binary operations that inverses a bitwise OR to AND.
      // If F(x) = binary(x, c), and F(x) inverses OR,
      // that is,
      //
      //   F(x) | F(y) == F(x & y)
      //
      // Then also
      //
      //   binary(x, c) | binary(y, c)  =>  binary(x & y, c)
      Binary *bx, *by;
      Expression *x, *y;
      Const *cx, *cy;
      if (matches(curr->left, binary(&bx, any(&x), ival(&cx))) &&
          matches(curr->right, binary(&by, any(&y), ival(&cy))) &&
          bx->op == by->op && x->type == y->type && cx->value == cy->value &&
          inversesOr(bx)) {
        by->op = getBinary(x->type, And);
        by->type = x->type;
        by->left = x;
        by->right = y;
        bx->left = by;
        return bx;
      }
    }
    {
      // Binary operations that preserve a bitwise OR can be
      // reordered. If F(x) = binary(x, c), and F(x) preserves OR,
      // that is,
      //
      //   F(x) | F(y) == F(x | y)
      //
      // Then also
      //
      //   binary(x, c) | binary(y, c)  =>  binary(x | y, c)
      Binary *bx, *by;
      Expression *x, *y;
      Const *cx, *cy;
      if (matches(curr->left, binary(&bx, any(&x), ival(&cx))) &&
          matches(curr->right, binary(&by, any(&y), ival(&cy))) &&
          bx->op == by->op && x->type == y->type && cx->value == cy->value &&
          preserveOr(bx)) {
        by->op = getBinary(x->type, Or);
        by->type = x->type;
        by->left = x;
        by->right = y;
        bx->left = by;
        return bx;
      }
    }
    return nullptr;
  }